

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O0

ostream * boost::unit_test::utils::operator<<
                    (custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>
                     *p,const_string *value)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  basic_cstring<const_char> *in_RSI;
  basic_cstring<const_char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> *unaff_retaddr;
  const_string *in_stack_00000008;
  ostream *in_stack_00000010;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  
  custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>::
  operator*((custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>
             *)in_RDI);
  basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_20,"<![CDATA[",9);
  unit_test::operator<<(unaff_retaddr,in_RDI);
  custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>::
  operator*((custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>
             *)in_RDI);
  basic_cstring<const_char>::basic_cstring(&local_30,in_RSI);
  print_escaped_cdata(in_stack_00000010,in_stack_00000008);
  custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>::
  operator*((custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>
             *)in_RDI);
  basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_40,"]]>",3);
  pbVar1 = unit_test::operator<<(unaff_retaddr,in_RDI);
  return pbVar1;
}

Assistant:

inline std::ostream&
operator<<( custom_printer<cdata> const& p, const_string value )
{
    *p << BOOST_TEST_L( "<![CDATA[" );
    print_escaped_cdata( *p, value );
    return  *p << BOOST_TEST_L( "]]>" );
}